

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

ly_bool lyd_hash_table_schema_val_equal
                  (void *val1_p,void *val2_p,ly_bool UNUSED_mod,void *UNUSED_cb_data)

{
  return *val1_p == *(long *)(*val2_p + 8);
}

Assistant:

static ly_bool
lyd_hash_table_schema_val_equal(void *val1_p, void *val2_p, ly_bool UNUSED(mod), void *UNUSED(cb_data))
{
    struct lysc_node *val1;
    struct lyd_node *val2;

    val1 = *((struct lysc_node **)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (val1 == val2->schema) {
        /* schema match is enough */
        return 1;
    } else {
        return 0;
    }
}